

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

Stream * rw::wdgl::readNativeSkin(Stream *stream,int32 param_2,void *object,int32 offset)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  char *pcVar5;
  Skin *this;
  int32 numBones;
  Skin *skin;
  undefined4 local_48;
  Error _e_1;
  Error _e;
  uint32 platform;
  Geometry *geometry;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 2) {
      this = (Skin *)mustmalloc_LOC(0x70,0x30116,
                                    "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 564"
                                   );
      *(Skin **)((long)object + (long)offset) = this;
      uVar4 = Stream::readI32(stream);
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar4);
      Stream::read32(stream,this->inverseMatrices,this->numBones << 6);
      stream_local = stream;
    }
    else {
      skin._4_4_ = 2;
      local_48 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp",0x231)
      ;
      pFVar1 = _stderr;
      pcVar5 = dbgsprint(0x80000006,(ulong)uVar3);
      fprintf(pFVar1,"%s\n",pcVar5);
      setError((Error *)((long)&skin + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp",0x22c);
    pFVar1 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar5);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

Stream*
readNativeSkin(Stream *stream, int32, void *object, int32 offset)
{
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_GL){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	int32 numBones = stream->readI32();
	skin->init(numBones, 0, 0);
	stream->read32(skin->inverseMatrices, skin->numBones*64);
	return stream;
}